

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsslsocket.cpp
# Opt level: O2

QString * QSslSocket::activeBackend(void)

{
  Data *pDVar1;
  char16_t *pcVar2;
  qsizetype qVar3;
  QArrayDataPointer<char16_t> *in_RDI;
  long in_FS_OFFSET;
  QArrayDataPointer<char16_t> local_48;
  undefined1 local_30 [16];
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  local_30._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_30._0_8_ = &QSslSocketPrivate::backendMutex;
  QBasicMutex::lock(&QSslSocketPrivate::backendMutex.super_QBasicMutex);
  local_30[8] = true;
  if (QSslSocketPrivate::activeBackendName.d.size == 0) {
    QTlsBackend::defaultBackendName();
    qVar3 = QSslSocketPrivate::activeBackendName.d.size;
    pcVar2 = QSslSocketPrivate::activeBackendName.d.ptr;
    pDVar1 = QSslSocketPrivate::activeBackendName.d.d;
    QSslSocketPrivate::activeBackendName.d.d = local_48.d;
    QSslSocketPrivate::activeBackendName.d.ptr = local_48.ptr;
    local_48.d = pDVar1;
    local_48.ptr = pcVar2;
    QSslSocketPrivate::activeBackendName.d.size = local_48.size;
    local_48.size = qVar3;
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_48);
  }
  QArrayDataPointer<char16_t>::QArrayDataPointer(in_RDI,&QSslSocketPrivate::activeBackendName.d);
  QMutexLocker<QMutex>::~QMutexLocker((QMutexLocker<QMutex> *)local_30);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return (QString *)in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

QString QSslSocket::activeBackend()
{
    const QMutexLocker locker(&QSslSocketPrivate::backendMutex);

    if (!QSslSocketPrivate::activeBackendName.size())
        QSslSocketPrivate::activeBackendName = QTlsBackend::defaultBackendName();

    return QSslSocketPrivate::activeBackendName;
}